

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples,bool logBucketPerformance)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer pcVar4;
  pointer pcVar5;
  void *pvVar6;
  pointer pUVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  SampleBuilder *pSVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pUVar15;
  ulong *puVar16;
  string *description;
  int *piVar17;
  ulong uVar18;
  int numBytes;
  int iVar19;
  LogNumber<float> *name;
  offset_in_SingleOperationDuration_to_deUint64 in_R9;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this;
  long lVar20;
  long lVar21;
  undefined8 *puVar22;
  size_t __n;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float xmin;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [12];
  UploadSampleAnalyzeResult UVar33;
  LineParametersWithConfidence startApproximation;
  LineParametersWithConfidence endApproximation;
  ScopedLogSection section;
  StatsType stats;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_2;
  ScopedLogSection section_1;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  buckets [4];
  StatsType resultStats;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  undefined1 local_a40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a30;
  string local_a20;
  string local_a00;
  qpSampleValueTag local_9e0;
  float local_9dc;
  undefined1 local_9d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8;
  string local_9b8;
  string local_998;
  qpSampleValueTag local_978;
  float local_974;
  string local_970;
  undefined1 local_950 [24];
  undefined3 local_938;
  undefined1 uStack_935;
  undefined4 local_934;
  float local_930;
  float local_92c;
  float local_928;
  float local_924;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  float local_5a0;
  float local_59c;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  float local_588;
  float local_584;
  LogNumber<float> local_580;
  LogNumber<float> local_518;
  LineParametersWithConfidence local_4ac;
  string local_490;
  LogNumber<float> local_470;
  ScopedLogSection local_408;
  LogNumber<float> local_400;
  LogNumber<float> local_398;
  LogNumber<float> local_330;
  LogNumber<float> local_2c8;
  LogNumber<float> local_260;
  LogNumber<float> local_1f8;
  LogNumber<float> local_190;
  string local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  SingleCallStatistics local_60;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            (&local_4ac,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),1,in_R9);
  calculateSampleStatistics(&local_60,&local_4ac,samples);
  local_a40._0_8_ = &aStack_a30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"Samples","");
  local_9d8._0_8_ = &local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_970,log,(string *)local_a40,(string *)local_9d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._0_8_ != &local_9c8) {
    operator_delete((void *)local_9d8._0_8_,local_9c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._0_8_ != &aStack_a30) {
    operator_delete((void *)local_a40._0_8_,aStack_a30._M_allocated_capacity + 1);
  }
  local_190.m_name._M_dataplus._M_p = (pointer)&local_190.m_name.field_2;
  local_190.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_190.m_name._M_string_length = 7;
  local_190.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_1f8.m_name._M_dataplus._M_p = (pointer)&local_1f8.m_name.field_2;
  local_1f8.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_1f8.m_name._M_string_length = 7;
  local_1f8.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_470,&local_190.m_name,&local_1f8.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_470.m_name,&local_470.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_260.m_name._M_dataplus._M_p = (pointer)&local_260.m_name.field_2;
  local_260.m_name.field_2._M_allocated_capacity._0_7_ = 0x6e657474697257;
  local_260.m_name.field_2._7_4_ = 0x657a6953;
  local_260.m_name._M_string_length = 0xb;
  local_260.m_name.field_2._M_local_buf[0xb] = '\0';
  local_2c8.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_name.field_2;
  local_2c8.m_name.field_2._M_allocated_capacity = 0x206e657474697257;
  local_2c8.m_name.field_2._8_4_ = 0x657a6973;
  local_2c8.m_name._M_string_length = 0xc;
  local_2c8.m_name.field_2._M_local_buf[0xc] = '\0';
  local_330.m_name._M_dataplus._M_p = (pointer)&local_330.m_name.field_2;
  local_330.m_name.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_330.m_name.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_330.m_name._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a40,&local_260.m_name,&local_2c8.m_name,&local_330.m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a40,&local_a20,&local_a00,local_9e0);
  local_398.m_name._M_dataplus._M_p = (pointer)&local_398.m_name.field_2;
  local_398.m_name.field_2._M_allocated_capacity = 0x6953726566667542;
  local_398.m_name.field_2._8_2_ = 0x657a;
  local_398.m_name._M_string_length = 10;
  local_398.m_name.field_2._M_local_buf[10] = '\0';
  local_400.m_name._M_dataplus._M_p = (pointer)&local_400.m_name.field_2;
  local_400.m_name.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_400.m_name.field_2._7_4_ = 0x657a6973;
  local_400.m_name._M_string_length = 0xb;
  local_400.m_name.field_2._M_local_buf[0xb] = '\0';
  local_128.field_2._M_allocated_capacity._0_6_ = 0x7365747962;
  local_128._M_string_length = 5;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_9d8,&local_398.m_name,&local_400.m_name,&local_128,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_9d8,&local_9b8,&local_998,local_978);
  local_950._16_8_ = 0x695464616f6c7055;
  local_950._8_8_ = 10;
  local_938 = 0x656d;
  local_a60.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_a60.field_2._7_4_ = 0x656d6974;
  local_a60._M_string_length = 0xb;
  local_a60.field_2._M_local_buf[0xb] = '\0';
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  local_aa0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_aa0._M_string_length = 2;
  local_aa0.field_2._M_local_buf[2] = '\0';
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  local_950._0_8_ = local_950 + 0x10;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_518,(string *)local_950,&local_a60,&local_aa0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_518.m_name,&local_518.m_desc,&local_518.m_unit,local_518.m_tag);
  local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
  local_a80.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_a80.field_2._7_4_ = 0x6c617564;
  local_a80._M_string_length = 0xb;
  local_a80.field_2._M_local_buf[0xb] = '\0';
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  local_ac0.field_2._M_allocated_capacity = 0x6973657220746946;
  local_ac0.field_2._8_4_ = 0x6c617564;
  local_ac0._M_string_length = 0xc;
  local_ac0.field_2._M_local_buf[0xc] = '\0';
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  local_ae0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_ae0._M_string_length = 2;
  local_ae0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_580,&local_a80,&local_ac0,&local_ae0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  name = &local_580;
  tcu::TestLog::writeValueInfo
            (log,&name->m_name,&local_580.m_desc,&local_580.m_unit,local_580.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
    name = (LogNumber<float> *)(local_580.m_unit.field_2._M_allocated_capacity + 1);
    operator_delete(local_580.m_unit._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
    name = (LogNumber<float> *)(local_580.m_desc.field_2._M_allocated_capacity + 1);
    operator_delete(local_580.m_desc._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
    name = (LogNumber<float> *)(local_580.m_name.field_2._M_allocated_capacity + 1);
    operator_delete(local_580.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    name = (LogNumber<float> *)
           (CONCAT53(local_ae0.field_2._M_allocated_capacity._3_5_,
                     CONCAT12(local_ae0.field_2._M_local_buf[2],
                              local_ae0.field_2._M_allocated_capacity._0_2_)) + 1);
    operator_delete(local_ae0._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    name = (LogNumber<float> *)(local_ac0.field_2._M_allocated_capacity + 1);
    operator_delete(local_ac0._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    name = (LogNumber<float> *)
           (CONCAT17(local_a80.field_2._M_local_buf[7],local_a80.field_2._M_allocated_capacity._0_7_
                    ) + 1);
    operator_delete(local_a80._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
    name = (LogNumber<float> *)(local_518.m_unit.field_2._M_allocated_capacity + 1);
    operator_delete(local_518.m_unit._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
    name = (LogNumber<float> *)(local_518.m_desc.field_2._M_allocated_capacity + 1);
    operator_delete(local_518.m_desc._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    name = (LogNumber<float> *)(local_518.m_name.field_2._M_allocated_capacity + 1);
    operator_delete(local_518.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    name = (LogNumber<float> *)
           (CONCAT53(local_aa0.field_2._M_allocated_capacity._3_5_,
                     CONCAT12(local_aa0.field_2._M_local_buf[2],
                              local_aa0.field_2._M_allocated_capacity._0_2_)) + 1);
    operator_delete(local_aa0._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    name = (LogNumber<float> *)
           (CONCAT17(local_a60.field_2._M_local_buf[7],local_a60.field_2._M_allocated_capacity._0_7_
                    ) + 1);
    operator_delete(local_a60._M_dataplus._M_p,(ulong)name);
  }
  if ((undefined1 *)local_950._0_8_ != local_950 + 0x10) {
    name = (LogNumber<float> *)(local_950._16_8_ + 1);
    operator_delete((void *)local_950._0_8_,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    name = (LogNumber<float> *)(local_998.field_2._M_allocated_capacity + 1);
    operator_delete(local_998._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    name = (LogNumber<float> *)(local_9b8.field_2._M_allocated_capacity + 1);
    operator_delete(local_9b8._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._0_8_ != &local_9c8) {
    name = (LogNumber<float> *)(local_9c8._M_allocated_capacity + 1);
    operator_delete((void *)local_9d8._0_8_,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    name = (LogNumber<float> *)(local_128.field_2._M_allocated_capacity + 1);
    operator_delete(local_128._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
    name = (LogNumber<float> *)
           (CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                     local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
    operator_delete(local_400.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
    name = (LogNumber<float> *)(local_398.m_name.field_2._M_allocated_capacity + 1);
    operator_delete(local_398.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    name = (LogNumber<float> *)(local_a00.field_2._M_allocated_capacity + 1);
    operator_delete(local_a00._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    name = (LogNumber<float> *)(local_a20.field_2._M_allocated_capacity + 1);
    operator_delete(local_a20._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._0_8_ != &aStack_a30) {
    name = (LogNumber<float> *)(aStack_a30._M_allocated_capacity + 1);
    operator_delete((void *)local_a40._0_8_,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    name = (LogNumber<float> *)
           (CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                     CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                              local_330.m_name.field_2._M_allocated_capacity._0_4_)) + 1);
    operator_delete(local_330.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    name = (LogNumber<float> *)(local_2c8.m_name.field_2._M_allocated_capacity + 1);
    operator_delete(local_2c8.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
    name = (LogNumber<float> *)
           (CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                     local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
    operator_delete(local_260.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
    name = (LogNumber<float> *)(local_470.m_desc.field_2._M_allocated_capacity + 1);
    operator_delete(local_470.m_desc._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    name = (LogNumber<float> *)(local_470.m_name.field_2._M_allocated_capacity + 1);
    operator_delete(local_470.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    name = (LogNumber<float> *)
           (CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                     local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    operator_delete(local_1f8.m_name._M_dataplus._M_p,(ulong)name);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
    name = (LogNumber<float> *)
           (CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                     local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
    operator_delete(local_190.m_name._M_dataplus._M_p,(ulong)name);
  }
  pUVar15 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar15) >> 5)) {
    lVar21 = 0;
    lVar20 = 0;
    do {
      uVar13 = *(ulong *)((long)&(pUVar15->duration).fitResponseDuration + lVar21);
      fVar24 = (float)*(int *)((long)&pUVar15->writtenSize + lVar21) * local_4ac.coefficient +
               local_4ac.offset;
      local_a40._8_8_ = (pointer)0x0;
      aStack_a30._M_allocated_capacity = 0;
      aStack_a30._8_8_ = 0;
      local_a40._0_8_ = log;
      pSVar12 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a40,*(int *)((long)&pUVar15->writtenSize + lVar21)
                          );
      pSVar12 = tcu::SampleBuilder::operator<<
                          (pSVar12,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  bufferSize + lVar21));
      pSVar12 = tcu::SampleBuilder::operator<<
                          (pSVar12,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).totalDuration + lVar21));
      pSVar12 = tcu::SampleBuilder::operator<<(pSVar12,(float)uVar13 - fVar24);
      name = (LogNumber<float> *)&tcu::TestLog::EndSample;
      tcu::SampleBuilder::operator<<(pSVar12,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a40._8_8_ != (pointer)0x0) {
        name = (LogNumber<float> *)(aStack_a30._8_8_ - local_a40._8_8_);
        operator_delete((void *)local_a40._8_8_,(ulong)name);
      }
      lVar20 = lVar20 + 1;
      pUVar15 = (samples->
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar21 = lVar21 + 0x20;
    } while (lVar20 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pUVar15) >> 5));
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_970._M_dataplus._M_p);
  if (logBucketPerformance) {
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_128.field_2._8_8_ = 0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    pUVar15 = (samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar23 = (uint)((ulong)((long)(samples->
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar15) >> 5)
    ;
    if ((int)uVar23 < 1) {
      iVar19 = 0;
      uVar23 = 0;
    }
    else {
      uVar13 = (ulong)(uVar23 & 0x7fffffff);
      piVar17 = &pUVar15->allocatedSize;
      in_R9 = 0;
      uVar23 = 0;
      uVar11 = 0;
      do {
        uVar3 = *piVar17;
        if ((int)uVar3 < (int)uVar23 || uVar23 == 0) {
          uVar11 = (uint)in_R9;
          uVar23 = uVar3;
        }
        name = (LogNumber<float> *)CONCAT71((int7)((ulong)name >> 8),uVar11 == 0);
        if ((int)uVar11 < (int)uVar3 || uVar11 == 0) {
          in_R9 = (offset_in_SingleOperationDuration_to_deUint64)uVar3;
          uVar11 = uVar3;
        }
        piVar17 = piVar17 + 8;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      iVar19 = (int)in_R9;
      lVar21 = 0;
      lVar20 = 0;
      do {
        puVar22 = (undefined8 *)((long)&pUVar15->bufferSize + lVar21);
        fVar24 = floorf(((float)(int)(*(int *)((long)&pUVar15->allocatedSize + lVar21) - uVar23) /
                        (float)(int)(iVar19 - uVar23)) * 4.0);
        uVar11 = (uint)fVar24;
        if (2 < (int)uVar11) {
          uVar11 = 3;
        }
        uVar13 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar13 = 0;
        }
        uVar13 = uVar13 * 3 & 0xffffffff;
        lVar1 = uVar13 * 8;
        pcVar4 = (pointer)(&local_128._M_string_length)[uVar13];
        if (pcVar4 == *(pointer *)((long)&local_128.field_2 + lVar1)) {
          pcVar5 = (&local_128._M_dataplus)[uVar13]._M_p;
          __n = (long)pcVar4 - (long)pcVar5;
          if (__n == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar18 = (long)__n >> 5;
          local_a8._0_8_ = pcVar5;
          uVar14 = uVar18;
          if (pcVar4 == pcVar5) {
            uVar14 = 1;
          }
          this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  *)(uVar14 + uVar18);
          if ((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
               *)0x3fffffffffffffe < this) {
            this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)0x3ffffffffffffff;
          }
          if (CARRY8(uVar14,uVar18)) {
            this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)0x3ffffffffffffff;
          }
          pUVar15 = std::
                    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    ::_M_allocate(this,(size_t)name);
          uVar8 = *puVar22;
          uVar9 = puVar22[1];
          uVar10 = puVar22[3];
          puVar2 = (undefined8 *)((long)pUVar15 + __n + 0x10);
          *puVar2 = puVar22[2];
          puVar2[1] = uVar10;
          *(undefined8 *)((long)pUVar15 + __n) = uVar8;
          ((undefined8 *)((long)pUVar15 + __n))[1] = uVar9;
          uVar8 = local_a8._0_8_;
          if (0 < (long)__n) {
            name = (LogNumber<float> *)local_a8._0_8_;
            memmove(pUVar15,(void *)local_a8._0_8_,__n);
          }
          if ((LogNumber<float> *)uVar8 != (LogNumber<float> *)0x0) {
            name = (LogNumber<float> *)(*(long *)((long)&local_128.field_2 + lVar1) - uVar8);
            operator_delete((void *)uVar8,(ulong)name);
          }
          (&local_128._M_dataplus)[uVar13]._M_p = (pointer)pUVar15;
          (&local_128._M_string_length)[uVar13] = (long)pUVar15 + __n + 0x20;
          *(pointer *)((long)&local_128.field_2 + lVar1) = pUVar15 + (long)this;
        }
        else {
          uVar8 = *puVar22;
          uVar9 = puVar22[1];
          uVar10 = puVar22[3];
          *(undefined8 *)(pcVar4 + 0x10) = puVar22[2];
          *(undefined8 *)(pcVar4 + 0x18) = uVar10;
          *(undefined8 *)pcVar4 = uVar8;
          *(undefined8 *)(pcVar4 + 8) = uVar9;
          (&local_128._M_string_length)[uVar13] = (&local_128._M_string_length)[uVar13] + 0x20;
        }
        lVar20 = lVar20 + 1;
        pUVar15 = (samples->
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar21 = lVar21 + 0x20;
      } while (lVar20 < (int)((ulong)((long)(samples->
                                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pUVar15) >> 5));
    }
    lVar20 = 0;
    do {
      if ((&local_128._M_dataplus)[lVar20 * 3]._M_p !=
          (pointer)(&local_128._M_string_length)[lVar20 * 3]) {
        calculateSampleStatistics
                  ((SingleCallStatistics *)local_950,&local_4ac,
                   (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                    *)(&local_128._M_dataplus + lVar20 * 3));
        local_a40._0_8_ = &aStack_a30;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"BufferSizeRange","");
        local_9d8._0_8_ = &local_9c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9d8,"Transfer performance with buffer size in range [","");
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_518.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)((int)((float)(int)lVar20 * 0.25 * (float)(int)(iVar19 - uVar23)) + uVar23
                          ),numBytes);
        auVar32 = std::__cxx11::string::append((char *)&local_518);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_580.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)((int)((float)((int)lVar20 + 1) * 0.25 * (float)(int)(iVar19 - uVar23)) +
                          uVar23),auVar32._8_4_);
        puVar16 = (ulong *)std::__cxx11::string::append((char *)&local_580);
        puVar16 = (ulong *)std::__cxx11::string::_M_append(auVar32._0_8_,*puVar16);
        description = (string *)std::__cxx11::string::_M_append(local_9d8,*puVar16);
        tcu::ScopedLogSection::ScopedLogSection(&local_408,log,(string *)local_a40,description);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
          operator_delete(local_580.m_name._M_dataplus._M_p,
                          local_580.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
          operator_delete(local_518.m_name._M_dataplus._M_p,
                          local_518.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d8._0_8_ != &local_9c8) {
          operator_delete((void *)local_9d8._0_8_,local_9c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a40._0_8_ != &aStack_a30) {
          operator_delete((void *)local_a40._0_8_,aStack_a30._M_allocated_capacity + 1);
        }
        local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"Min","");
        local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"Total: Min time","");
        local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a80,"us","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_a40,&local_a60,&local_aa0,&local_a80,QP_KEY_TAG_TIME,
                   (float)local_950._0_4_);
        tcu::TestLog::writeFloat
                  (log,(char *)local_a40._0_8_,local_a20._M_dataplus._M_p,local_a00._M_dataplus._M_p
                   ,local_9e0,local_9dc);
        local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"Max","");
        local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae0,"Total: Max time","");
        local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"us","");
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_9d8,&local_ac0,&local_ae0,&local_970,QP_KEY_TAG_TIME,
                   (float)local_950._4_4_);
        tcu::TestLog::writeFloat
                  (log,(char *)local_9d8._0_8_,local_9b8._M_dataplus._M_p,local_998._M_dataplus._M_p
                   ,local_978,local_974);
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"Min90","");
        local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_760,"Total: 90%-Min time","");
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_518,&local_740,&local_760,&local_680,QP_KEY_TAG_TIME,
                   (float)local_950._12_4_);
        tcu::TestLog::writeFloat
                  (log,local_518.m_name._M_dataplus._M_p,local_518.m_desc._M_dataplus._M_p,
                   local_518.m_unit._M_dataplus._M_p,local_518.m_tag,local_518.m_value);
        local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"Max90","");
        local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7a0,"Total: 90%-Max time","");
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_580,&local_780,&local_7a0,&local_6a0,QP_KEY_TAG_TIME,
                   (float)local_950._16_4_);
        tcu::TestLog::writeFloat
                  (log,local_580.m_name._M_dataplus._M_p,local_580.m_desc._M_dataplus._M_p,
                   local_580.m_unit._M_dataplus._M_p,local_580.m_tag,local_580.m_value);
        local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"Median","");
        local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7e0,"Total: Median time","");
        local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_470,&local_7c0,&local_7e0,&local_6c0,QP_KEY_TAG_TIME,
                   (float)local_950._8_4_);
        tcu::TestLog::writeFloat
                  (log,local_470.m_name._M_dataplus._M_p,local_470.m_desc._M_dataplus._M_p,
                   local_470.m_unit._M_dataplus._M_p,local_470.m_tag,local_470.m_value);
        local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"MedianTransfer","");
        local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_820,"Median transfer rate","");
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"MB / s","");
        tcu::LogNumber<float>::LogNumber
                  (&local_190,&local_800,&local_820,&local_6e0,QP_KEY_TAG_PERFORMANCE,
                   (float)local_950._20_4_ * 0.0009765625 * 0.0009765625);
        tcu::TestLog::writeFloat
                  (log,local_190.m_name._M_dataplus._M_p,local_190.m_desc._M_dataplus._M_p,
                   local_190.m_unit._M_dataplus._M_p,local_190.m_tag,local_190.m_value);
        local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"MaxDiff","");
        local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_860,"Max difference to approximated","");
        local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_1f8,&local_840,&local_860,&local_700,QP_KEY_TAG_TIME,(float)_local_938);
        tcu::TestLog::writeFloat
                  (log,local_1f8.m_name._M_dataplus._M_p,local_1f8.m_desc._M_dataplus._M_p,
                   local_1f8.m_unit._M_dataplus._M_p,local_1f8.m_tag,local_1f8.m_value);
        local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"Max90Diff","");
        local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8a0,"90%-Max difference to approximated","");
        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_260,&local_880,&local_8a0,&local_720,QP_KEY_TAG_TIME,(float)local_934);
        tcu::TestLog::writeFloat
                  (log,local_260.m_name._M_dataplus._M_p,local_260.m_desc._M_dataplus._M_p,
                   local_260.m_unit._M_dataplus._M_p,local_260.m_tag,local_260.m_value);
        local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"MedianDiff","");
        local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8e0,"Median difference to approximated","");
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"us","");
        tcu::LogNumber<float>::LogNumber
                  (&local_2c8,&local_8c0,&local_8e0,&local_5c0,QP_KEY_TAG_TIME,local_930);
        tcu::TestLog::writeFloat
                  (log,local_2c8.m_name._M_dataplus._M_p,local_2c8.m_desc._M_dataplus._M_p,
                   local_2c8.m_unit._M_dataplus._M_p,local_2c8.m_tag,local_2c8.m_value);
        local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"MaxRelDiff","");
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_620,"Max relative difference to approximated","");
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_330,&local_900,&local_620,&local_5e0,QP_KEY_TAG_NONE,local_92c * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_330.m_name._M_dataplus._M_p,local_330.m_desc._M_dataplus._M_p,
                   local_330.m_unit._M_dataplus._M_p,local_330.m_tag,local_330.m_value);
        local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"Max90RelDiff","");
        local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_920,"90%-Max relative difference to approximated","");
        local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_398,&local_640,&local_920,&local_600,QP_KEY_TAG_NONE,local_928 * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_398.m_name._M_dataplus._M_p,local_398.m_desc._M_dataplus._M_p,
                   local_398.m_unit._M_dataplus._M_p,local_398.m_tag,local_398.m_value);
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"MedianRelDiff","");
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_490,"Median relative difference to approximated","");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"%","");
        tcu::LogNumber<float>::LogNumber
                  (&local_400,&local_660,&local_490,&local_c8,QP_KEY_TAG_NONE,local_924 * 100.0);
        tcu::TestLog::writeFloat
                  (log,local_400.m_name._M_dataplus._M_p,local_400.m_desc._M_dataplus._M_p,
                   local_400.m_unit._M_dataplus._M_p,local_400.m_tag,local_400.m_value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_unit._M_dataplus._M_p != &local_400.m_unit.field_2) {
          operator_delete(local_400.m_unit._M_dataplus._M_p,
                          local_400.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_desc._M_dataplus._M_p != &local_400.m_desc.field_2) {
          operator_delete(local_400.m_desc._M_dataplus._M_p,
                          local_400.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
          operator_delete(local_400.m_name._M_dataplus._M_p,
                          CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                                   local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_unit._M_dataplus._M_p != &local_398.m_unit.field_2) {
          operator_delete(local_398.m_unit._M_dataplus._M_p,
                          local_398.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_desc._M_dataplus._M_p != &local_398.m_desc.field_2) {
          operator_delete(local_398.m_desc._M_dataplus._M_p,
                          local_398.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
          operator_delete(local_398.m_name._M_dataplus._M_p,
                          local_398.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920._M_dataplus._M_p != &local_920.field_2) {
          operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p != &local_640.field_2) {
          operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_unit._M_dataplus._M_p != &local_330.m_unit.field_2) {
          operator_delete(local_330.m_unit._M_dataplus._M_p,
                          local_330.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_desc._M_dataplus._M_p != &local_330.m_desc.field_2) {
          operator_delete(local_330.m_desc._M_dataplus._M_p,
                          local_330.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
          operator_delete(local_330.m_name._M_dataplus._M_p,
                          CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                                            local_330.m_name.field_2._M_allocated_capacity._0_4_)) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_900._M_dataplus._M_p != &local_900.field_2) {
          operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_unit._M_dataplus._M_p != &local_2c8.m_unit.field_2) {
          operator_delete(local_2c8.m_unit._M_dataplus._M_p,
                          local_2c8.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_desc._M_dataplus._M_p != &local_2c8.m_desc.field_2) {
          operator_delete(local_2c8.m_desc._M_dataplus._M_p,
                          local_2c8.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
          operator_delete(local_2c8.m_name._M_dataplus._M_p,
                          local_2c8.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
          operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
          operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_unit._M_dataplus._M_p != &local_260.m_unit.field_2) {
          operator_delete(local_260.m_unit._M_dataplus._M_p,
                          local_260.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_desc._M_dataplus._M_p != &local_260.m_desc.field_2) {
          operator_delete(local_260.m_desc._M_dataplus._M_p,
                          local_260.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
          operator_delete(local_260.m_name._M_dataplus._M_p,
                          CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                                   local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p != &local_720.field_2) {
          operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
          operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_880._M_dataplus._M_p != &local_880.field_2) {
          operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_unit._M_dataplus._M_p != &local_1f8.m_unit.field_2) {
          operator_delete(local_1f8.m_unit._M_dataplus._M_p,
                          local_1f8.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_desc._M_dataplus._M_p != &local_1f8.m_desc.field_2) {
          operator_delete(local_1f8.m_desc._M_dataplus._M_p,
                          local_1f8.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
          operator_delete(local_1f8.m_name._M_dataplus._M_p,
                          CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_840._M_dataplus._M_p != &local_840.field_2) {
          operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_unit._M_dataplus._M_p != &local_190.m_unit.field_2) {
          operator_delete(local_190.m_unit._M_dataplus._M_p,
                          local_190.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_desc._M_dataplus._M_p != &local_190.m_desc.field_2) {
          operator_delete(local_190.m_desc._M_dataplus._M_p,
                          local_190.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
          operator_delete(local_190.m_name._M_dataplus._M_p,
                          CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                                   local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_820._M_dataplus._M_p != &local_820.field_2) {
          operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_800._M_dataplus._M_p != &local_800.field_2) {
          operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_unit._M_dataplus._M_p != &local_470.m_unit.field_2) {
          operator_delete(local_470.m_unit._M_dataplus._M_p,
                          local_470.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
          operator_delete(local_470.m_desc._M_dataplus._M_p,
                          local_470.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
          operator_delete(local_470.m_name._M_dataplus._M_p,
                          local_470.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
          operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
          operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
          operator_delete(local_580.m_unit._M_dataplus._M_p,
                          local_580.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
          operator_delete(local_580.m_desc._M_dataplus._M_p,
                          local_580.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
          operator_delete(local_580.m_name._M_dataplus._M_p,
                          local_580.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
          operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
          operator_delete(local_518.m_unit._M_dataplus._M_p,
                          local_518.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
          operator_delete(local_518.m_desc._M_dataplus._M_p,
                          local_518.m_desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
          operator_delete(local_518.m_name._M_dataplus._M_p,
                          local_518.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_dataplus._M_p != &local_760.field_2) {
          operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_998._M_dataplus._M_p != &local_998.field_2) {
          operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
          operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9d8._0_8_ != &local_9c8) {
          operator_delete((void *)local_9d8._0_8_,local_9c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_970._M_dataplus._M_p != &local_970.field_2) {
          operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
          operator_delete(local_ae0._M_dataplus._M_p,
                          CONCAT53(local_ae0.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_ae0.field_2._M_local_buf[2],
                                            local_ae0.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
          operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
          operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
          operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a40._0_8_ != &aStack_a30) {
          operator_delete((void *)local_a40._0_8_,aStack_a30._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
          operator_delete(local_a80._M_dataplus._M_p,
                          CONCAT17(local_a80.field_2._M_local_buf[7],
                                   local_a80.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
          operator_delete(local_aa0._M_dataplus._M_p,
                          CONCAT53(local_aa0.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_aa0.field_2._M_local_buf[2],
                                            local_aa0.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
          operator_delete(local_a60._M_dataplus._M_p,
                          CONCAT17(local_a60.field_2._M_local_buf[7],
                                   local_a60.field_2._M_allocated_capacity._0_7_) + 1);
        }
        tcu::TestLog::endSection(local_408.m_log);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = 0x60;
    do {
      pvVar6 = *(void **)((long)&local_190.m_unit.field_2 + lVar20);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,*(long *)((long)&local_190.m_tag + lVar20) - (long)pvVar6);
      }
      lVar20 = lVar20 + -0x18;
    } while (lVar20 != 0);
  }
  local_a40._0_8_ = &aStack_a30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"Results","");
  local_9d8._0_8_ = &local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_490,log,(string *)local_a40,(string *)local_9d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._0_8_ != &local_9c8) {
    operator_delete((void *)local_9d8._0_8_,local_9c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._0_8_ != &aStack_a30) {
    operator_delete((void *)local_a40._0_8_,aStack_a30._M_allocated_capacity + 1);
  }
  pUVar15 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pUVar7 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar25 = (float)((pUVar7[-1].bufferSize + pUVar15->bufferSize) / 2);
  local_5a0 = local_4ac.coefficient * fVar25;
  local_59c = local_4ac.offset + local_5a0;
  uVar13 = (long)pUVar7 - (long)pUVar15;
  iVar19 = (int)(((uint)(uVar13 >> 0x24) & 1) + (int)(uVar13 >> 5)) >> 1;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a40,samples,0,iVar19,1,in_R9);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_9d8,samples,iVar19,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),1,in_R9);
  pUVar15 = (samples->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pUVar7 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar24 = (float)pUVar15->writtenSize;
  fVar28 = (float)pUVar7[-1].writtenSize;
  local_588 = (float)local_a40._0_4_;
  local_a8 = ZEXT416((uint)local_a40._12_4_);
  local_584 = (float)local_9d8._0_4_;
  local_78 = ZEXT416((uint)local_9d8._12_4_);
  fVar26 = getAreaBetweenLines(fVar24,fVar28,(float)local_a40._0_4_,(float)local_a40._12_4_,
                               (float)local_9d8._0_4_,(float)local_9d8._12_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_a40,samples,0,
             (int)((ulong)((long)pUVar7 - (long)pUVar15) >> 5),2,in_R9);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ((LineParametersWithConfidence *)local_9d8,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),2,in_R9);
  xmin = (float)((samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_58c = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_598 = (float)local_a40._0_4_;
  local_88 = ZEXT416((uint)local_a40._12_4_);
  local_594 = (float)local_9d8._0_4_;
  local_98 = ZEXT416((uint)local_9d8._12_4_);
  local_590 = getAreaBetweenLines(xmin,local_58c,(float)local_a40._0_4_,(float)local_a40._12_4_,
                                  (float)local_9d8._0_4_,(float)local_9d8._12_4_);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ResultLinearity","");
  local_950._0_8_ = local_950 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_950,"Sample linearity","");
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"%","");
  fVar27 = (float)local_a8._0_4_ * fVar24 + local_588;
  fVar29 = (float)local_78._0_4_ * fVar24 + local_584;
  uVar23 = -(uint)(fVar27 <= fVar29);
  fVar30 = (float)local_a8._0_4_ * fVar28 + local_588;
  fVar31 = (float)local_78._0_4_ * fVar28 + local_584;
  uVar11 = -(uint)(fVar31 <= fVar30);
  fVar24 = ((float)(~uVar11 & (uint)fVar31 | (uint)fVar30 & uVar11) -
           (float)(~uVar23 & (uint)fVar29 | (uint)fVar27 & uVar23)) * (fVar28 - fVar24);
  fVar26 = (float)(~-(uint)(fVar24 < 1e-06) & (uint)(1.0 - fVar26 / fVar24));
  fVar24 = 1.0;
  if (fVar26 <= 1.0) {
    fVar24 = fVar26;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a40,&local_128,(string *)local_950,&local_a60,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar26 < 0.0) & (uint)(fVar24 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a40._0_8_,local_a20._M_dataplus._M_p,local_a00._M_dataplus._M_p,
             local_9e0,local_9dc);
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"SampleTemporalStability","")
  ;
  local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a80,"Sample temporal stability","");
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"%","");
  fVar24 = (float)local_88._0_4_ * xmin + local_598;
  fVar26 = (float)local_98._0_4_ * xmin + local_594;
  uVar23 = -(uint)(fVar24 <= fVar26);
  fVar27 = (float)local_88._0_4_ * local_58c + local_598;
  fVar28 = (float)local_98._0_4_ * local_58c + local_594;
  uVar11 = -(uint)(fVar28 <= fVar27);
  fVar24 = ((float)(~uVar11 & (uint)fVar28 | (uint)fVar27 & uVar11) -
           (float)(~uVar23 & (uint)fVar26 | (uint)fVar24 & uVar23)) * (local_58c - xmin);
  fVar26 = (float)(~-(uint)(fVar24 < 1e-06) & (uint)(1.0 - local_590 / fVar24));
  fVar24 = 1.0;
  if (fVar26 <= 1.0) {
    fVar24 = fVar26;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_9d8,&local_aa0,&local_a80,&local_ac0,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar26 < 0.0) & (uint)(fVar24 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_9d8._0_8_,local_9b8._M_dataplus._M_p,local_998._M_dataplus._M_p,
             local_978,local_974);
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ae0,"ApproximatedConstantCost","");
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_970,"Approximated contant cost","");
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_518,&local_ae0,&local_970,&local_740,QP_KEY_TAG_TIME,local_4ac.offset);
  tcu::TestLog::writeFloat
            (log,local_518.m_name._M_dataplus._M_p,local_518.m_desc._M_dataplus._M_p,
             local_518.m_unit._M_dataplus._M_p,local_518.m_tag,local_518.m_value);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_760,"ApproximatedConstantCostConfidence60Lower","");
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_680,"Approximated contant cost 60% confidence lower limit","");
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_580,&local_760,&local_680,&local_780,QP_KEY_TAG_TIME,
             local_4ac.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_580.m_name._M_dataplus._M_p,local_580.m_desc._M_dataplus._M_p,
             local_580.m_unit._M_dataplus._M_p,local_580.m_tag,local_580.m_value);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7a0,"ApproximatedConstantCostConfidence60Upper","");
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6a0,"Approximated contant cost 60% confidence upper limit","");
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_470,&local_7a0,&local_6a0,&local_7c0,QP_KEY_TAG_TIME,
             local_4ac.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_470.m_name._M_dataplus._M_p,local_470.m_desc._M_dataplus._M_p,
             local_470.m_unit._M_dataplus._M_p,local_470.m_tag,local_470.m_value);
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"ApproximatedLinearCost","");
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6c0,"Approximated linear cost","");
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_190,&local_7e0,&local_6c0,&local_800,QP_KEY_TAG_TIME,
             local_4ac.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_190.m_name._M_dataplus._M_p,local_190.m_desc._M_dataplus._M_p,
             local_190.m_unit._M_dataplus._M_p,local_190.m_tag,local_190.m_value);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_820,"ApproximatedLinearCostConfidence60Lower","");
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e0,"Approximated linear cost 60% confidence lower limit","");
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_1f8,&local_820,&local_6e0,&local_840,QP_KEY_TAG_TIME,
             local_4ac.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_1f8.m_name._M_dataplus._M_p,local_1f8.m_desc._M_dataplus._M_p,
             local_1f8.m_unit._M_dataplus._M_p,local_1f8.m_tag,local_1f8.m_value);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_860,"ApproximatedLinearCostConfidence60Upper","");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"Approximated linear cost 60% confidence upper limit","");
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_260,&local_860,&local_700,&local_880,QP_KEY_TAG_TIME,
             local_4ac.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_260.m_name._M_dataplus._M_p,local_260.m_desc._M_dataplus._M_p,
             local_260.m_unit._M_dataplus._M_p,local_260.m_tag,local_260.m_value);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"ApproximatedTransferRate","");
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_720,"Approximated transfer rate","");
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"MB / s","");
  fVar24 = fVar25 / ((local_59c / 1000.0) / 1000.0);
  tcu::LogNumber<float>::LogNumber
            (&local_2c8,&local_8a0,&local_720,&local_8c0,QP_KEY_TAG_PERFORMANCE,
             fVar24 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_2c8.m_name._M_dataplus._M_p,local_2c8.m_desc._M_dataplus._M_p,
             local_2c8.m_unit._M_dataplus._M_p,local_2c8.m_tag,local_2c8.m_value);
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e0,"ApproximatedTransferRateNoConstant","");
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c0,"Approximated transfer rate without constant cost","");
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"MB / s","");
  fVar25 = fVar25 / ((local_5a0 / 1000.0) / 1000.0);
  tcu::LogNumber<float>::LogNumber
            (&local_330,&local_8e0,&local_5c0,&local_900,QP_KEY_TAG_PERFORMANCE,
             fVar25 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_330.m_name._M_dataplus._M_p,local_330.m_desc._M_dataplus._M_p,
             local_330.m_unit._M_dataplus._M_p,local_330.m_tag,local_330.m_value);
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"SampleMedianTime","");
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"Median sample time","");
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_398,&local_620,&local_5e0,&local_640,QP_KEY_TAG_TIME,local_60.result.medianTime)
  ;
  tcu::TestLog::writeFloat
            (log,local_398.m_name._M_dataplus._M_p,local_398.m_desc._M_dataplus._M_p,
             local_398.m_unit._M_dataplus._M_p,local_398.m_tag,local_398.m_value);
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"SampleMedianTransfer","");
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"Median transfer rate","");
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_400,&local_920,&local_600,&local_660,QP_KEY_TAG_PERFORMANCE,
             local_60.medianRate * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_400.m_name._M_dataplus._M_p,local_400.m_desc._M_dataplus._M_p,
             local_400.m_unit._M_dataplus._M_p,local_400.m_tag,local_400.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_unit._M_dataplus._M_p != &local_400.m_unit.field_2) {
    operator_delete(local_400.m_unit._M_dataplus._M_p,
                    local_400.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_desc._M_dataplus._M_p != &local_400.m_desc.field_2) {
    operator_delete(local_400.m_desc._M_dataplus._M_p,
                    local_400.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_name._M_dataplus._M_p != &local_400.m_name.field_2) {
    operator_delete(local_400.m_name._M_dataplus._M_p,
                    CONCAT17(local_400.m_name.field_2._M_local_buf[7],
                             local_400.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_unit._M_dataplus._M_p != &local_398.m_unit.field_2) {
    operator_delete(local_398.m_unit._M_dataplus._M_p,
                    local_398.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_desc._M_dataplus._M_p != &local_398.m_desc.field_2) {
    operator_delete(local_398.m_desc._M_dataplus._M_p,
                    local_398.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
    operator_delete(local_398.m_name._M_dataplus._M_p,
                    local_398.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_unit._M_dataplus._M_p != &local_330.m_unit.field_2) {
    operator_delete(local_330.m_unit._M_dataplus._M_p,
                    local_330.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_desc._M_dataplus._M_p != &local_330.m_desc.field_2) {
    operator_delete(local_330.m_desc._M_dataplus._M_p,
                    local_330.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330.m_name._M_dataplus._M_p != &local_330.m_name.field_2) {
    operator_delete(local_330.m_name._M_dataplus._M_p,
                    CONCAT26(local_330.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_330.m_name.field_2._M_allocated_capacity._4_2_,
                                      local_330.m_name.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_unit._M_dataplus._M_p != &local_2c8.m_unit.field_2) {
    operator_delete(local_2c8.m_unit._M_dataplus._M_p,
                    local_2c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_desc._M_dataplus._M_p != &local_2c8.m_desc.field_2) {
    operator_delete(local_2c8.m_desc._M_dataplus._M_p,
                    local_2c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    operator_delete(local_2c8.m_name._M_dataplus._M_p,
                    local_2c8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_unit._M_dataplus._M_p != &local_260.m_unit.field_2) {
    operator_delete(local_260.m_unit._M_dataplus._M_p,
                    local_260.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_desc._M_dataplus._M_p != &local_260.m_desc.field_2) {
    operator_delete(local_260.m_desc._M_dataplus._M_p,
                    local_260.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.m_name._M_dataplus._M_p != &local_260.m_name.field_2) {
    operator_delete(local_260.m_name._M_dataplus._M_p,
                    CONCAT17(local_260.m_name.field_2._M_local_buf[7],
                             local_260.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_unit._M_dataplus._M_p != &local_1f8.m_unit.field_2) {
    operator_delete(local_1f8.m_unit._M_dataplus._M_p,
                    local_1f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_desc._M_dataplus._M_p != &local_1f8.m_desc.field_2) {
    operator_delete(local_1f8.m_desc._M_dataplus._M_p,
                    local_1f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    operator_delete(local_1f8.m_name._M_dataplus._M_p,
                    CONCAT44(local_1f8.m_name.field_2._M_allocated_capacity._4_4_,
                             local_1f8.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_unit._M_dataplus._M_p != &local_190.m_unit.field_2) {
    operator_delete(local_190.m_unit._M_dataplus._M_p,
                    local_190.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_desc._M_dataplus._M_p != &local_190.m_desc.field_2) {
    operator_delete(local_190.m_desc._M_dataplus._M_p,
                    local_190.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
    operator_delete(local_190.m_name._M_dataplus._M_p,
                    CONCAT44(local_190.m_name.field_2._M_allocated_capacity._4_4_,
                             local_190.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_unit._M_dataplus._M_p != &local_470.m_unit.field_2) {
    operator_delete(local_470.m_unit._M_dataplus._M_p,
                    local_470.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_desc._M_dataplus._M_p != &local_470.m_desc.field_2) {
    operator_delete(local_470.m_desc._M_dataplus._M_p,
                    local_470.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.m_name._M_dataplus._M_p != &local_470.m_name.field_2) {
    operator_delete(local_470.m_name._M_dataplus._M_p,
                    local_470.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_unit._M_dataplus._M_p != &local_580.m_unit.field_2) {
    operator_delete(local_580.m_unit._M_dataplus._M_p,
                    local_580.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_desc._M_dataplus._M_p != &local_580.m_desc.field_2) {
    operator_delete(local_580.m_desc._M_dataplus._M_p,
                    local_580.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.m_name._M_dataplus._M_p != &local_580.m_name.field_2) {
    operator_delete(local_580.m_name._M_dataplus._M_p,
                    local_580.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_unit._M_dataplus._M_p != &local_518.m_unit.field_2) {
    operator_delete(local_518.m_unit._M_dataplus._M_p,
                    local_518.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_desc._M_dataplus._M_p != &local_518.m_desc.field_2) {
    operator_delete(local_518.m_desc._M_dataplus._M_p,
                    local_518.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.m_name._M_dataplus._M_p != &local_518.m_name.field_2) {
    operator_delete(local_518.m_name._M_dataplus._M_p,
                    local_518.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p,
                    CONCAT53(local_ae0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_ae0.field_2._M_local_buf[2],
                                      local_ae0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._0_8_ != &local_9c8) {
    operator_delete((void *)local_9d8._0_8_,local_9c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,
                    CONCAT17(local_a80.field_2._M_local_buf[7],
                             local_a80.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,
                    CONCAT53(local_aa0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_aa0.field_2._M_local_buf[2],
                                      local_aa0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._0_8_ != &aStack_a30) {
    operator_delete((void *)local_a40._0_8_,aStack_a30._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,
                    CONCAT17(local_a60.field_2._M_local_buf[7],
                             local_a60.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((undefined1 *)local_950._0_8_ != local_950 + 0x10) {
    operator_delete((void *)local_950._0_8_,local_950._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_490._M_dataplus._M_p);
  UVar33.transferRateAtRange = fVar24;
  UVar33.transferRateMedian = local_60.medianRate;
  UVar33.transferRateAtInfinity = fVar25;
  return UVar33;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}